

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  char *local_58;
  char *install_name_dir;
  allocator<char> local_39;
  string local_38;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *this_local;
  string *dir;
  
  this_00 = this->Makefile;
  local_18 = this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_39);
  bVar1 = cmMakefile::IsOn(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (bVar1) {
    install_name_dir._3_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"INSTALL_NAME_DIR",&local_79);
    pcVar2 = GetProperty(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    local_58 = pcVar2;
    bVar1 = CanGenerateInstallNameDir(this,INSTALL_NAME_FOR_INSTALL);
    if (((bVar1) && (local_58 != (char *)0x0)) && (*local_58 != '\0')) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    }
    if ((local_58 == (char *)0x0) && (bVar1 = MacOSXRpathInstallNameDirDefault(this), bVar1)) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"@rpath/");
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_7a);
    std::allocator<char>::~allocator(&local_7a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetInstallNameDirForInstallTree() const
{
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    std::string dir;
    const char* install_name_dir = this->GetProperty("INSTALL_NAME_DIR");

    if (this->CanGenerateInstallNameDir(INSTALL_NAME_FOR_INSTALL)) {
      if (install_name_dir && *install_name_dir) {
        dir = install_name_dir;
        dir += "/";
      }
    }
    if (!install_name_dir) {
      if (this->MacOSXRpathInstallNameDirDefault()) {
        dir = "@rpath/";
      }
    }
    return dir;
  }
  return "";
}